

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O0

void __thiscall
Kernel::Signature::Symbol::addToDistinctGroup(Symbol *this,uint group,uint this_number)

{
  SmartPtr<Lib::Stack<unsigned_int>_> *ptr;
  uint in_ESI;
  DistinctGroupMembers members;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  Stack<unsigned_int> *this_00;
  Stack<unsigned_int> local_20;
  
  local_20._cursor._4_4_ = in_ESI;
  Lib::List<unsigned_int>::push
            ((uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
             (List<unsigned_int> **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(undefined1 *)(DAT_01333830 + 0x1c8) = 1;
  ptr = Lib::Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_>::operator[]
                  ((Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_> *)(DAT_01333830 + 0x1a8),
                   (ulong)local_20._cursor._4_4_);
  this_00 = &local_20;
  Lib::SmartPtr<Lib::Stack<unsigned_int>_>::SmartPtr
            ((SmartPtr<Lib::Stack<unsigned_int>_> *)this_00,ptr);
  Lib::SmartPtr<Lib::Stack<unsigned_int>_>::operator->
            ((SmartPtr<Lib::Stack<unsigned_int>_> *)this_00);
  Lib::Stack<unsigned_int>::push(this_00,in_stack_ffffffffffffffbc);
  Lib::SmartPtr<Lib::Stack<unsigned_int>_>::~SmartPtr
            ((SmartPtr<Lib::Stack<unsigned_int>_> *)this_00);
  return;
}

Assistant:

void Signature::Symbol::addToDistinctGroup(unsigned group,unsigned this_number)
{
  ASS_EQ(arity(), 0);
  ASS(!List<unsigned>::member(group, _distinctGroups))

  List<unsigned>::push(group, _distinctGroups);
  env.signature->_distinctGroupsAddedTo=true;

  Signature::DistinctGroupMembers members = env.signature->_distinctGroupMembers[group];
  members->push(this_number);
}